

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O2

char * old_create_transform_action_spec
                 (CMFormatList format_list,CMFormatList out_format_list,char *function)

{
  undefined8 *puVar1;
  FMFieldList p_Var2;
  int iVar3;
  CMFormatList pCVar4;
  FMStructDescList format_list_00;
  CMFormatList pCVar5;
  FMStructDescList out_format_list_00;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  uVar8 = 0x20;
  lVar7 = 0;
  for (pCVar4 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar4->format_name != (char *)0x0));
      pCVar4 = pCVar4 + 1) {
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 + 0x20;
  }
  pCVar4 = out_format_list;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar8 & 0x1fffffffe0);
  lVar9 = 8;
  while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
    *(undefined8 *)((long)format_list_00 + lVar9 * 2 + -0x10) =
         *(undefined8 *)((long)format_list + lVar9 + -8);
    p_Var2 = *(FMFieldList *)((long)&format_list->format_name + lVar9);
    *(FMFieldList *)((long)format_list_00 + lVar9 * 2 + -8) = p_Var2;
    iVar3 = struct_size_field_list(p_Var2,(int)pCVar4);
    *(int *)((long)&format_list_00->format_name + lVar9 * 2) = iVar3;
    *(undefined8 *)((long)&format_list_00->field_list + lVar9 * 2) = 0;
    lVar9 = lVar9 + 0x10;
  }
  puVar1 = (undefined8 *)((long)&format_list_00[-1].format_name + uVar8);
  *puVar1 = 0;
  puVar1[1] = 0;
  uVar8 = 0x20;
  lVar7 = 0;
  for (pCVar5 = out_format_list;
      (out_format_list != (CMFormatList)0x0 && (pCVar5->format_name != (char *)0x0));
      pCVar5 = pCVar5 + 1) {
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 + 0x20;
  }
  out_format_list_00 = (FMStructDescList)INT_CMmalloc(uVar8 & 0x1fffffffe0);
  lVar9 = 8;
  while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
    *(undefined8 *)((long)out_format_list_00 + lVar9 * 2 + -0x10) =
         *(undefined8 *)((long)out_format_list + lVar9 + -8);
    p_Var2 = *(FMFieldList *)((long)&out_format_list->format_name + lVar9);
    *(FMFieldList *)((long)out_format_list_00 + lVar9 * 2 + -8) = p_Var2;
    iVar3 = struct_size_field_list(p_Var2,(int)pCVar4);
    *(int *)((long)&out_format_list_00->format_name + lVar9 * 2) = iVar3;
    *(undefined8 *)((long)&out_format_list_00->field_list + lVar9 * 2) = 0;
    lVar9 = lVar9 + 0x10;
  }
  puVar1 = (undefined8 *)((long)&out_format_list_00[-1].format_name + uVar8);
  *puVar1 = 0;
  puVar1[1] = 0;
  pcVar6 = create_transform_action_spec(format_list_00,out_format_list_00,function);
  return pcVar6;
}

Assistant:

extern char *
old_create_transform_action_spec(CMFormatList format_list, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_transform_action_spec(structs, out_structs, function);
}